

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__fancy_alpha_weight_2ch(float *out_buffer,int width_times_channels)

{
  float *pfVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float *pfVar11;
  float *pfVar12;
  
  pfVar1 = out_buffer + (width_times_channels / 2) * 3;
  pfVar12 = pfVar1 + -(long)width_times_channels + 8;
  pfVar11 = pfVar1 + -(long)width_times_channels;
  while (pfVar12 <= pfVar1) {
    fVar3 = *pfVar11;
    fVar4 = pfVar11[1];
    fVar5 = pfVar11[2];
    fVar6 = pfVar11[3];
    fVar7 = pfVar11[4];
    fVar8 = pfVar11[5];
    fVar9 = pfVar11[6];
    fVar10 = pfVar11[7];
    *out_buffer = fVar3;
    out_buffer[1] = fVar4;
    out_buffer[2] = fVar3 * fVar4;
    out_buffer[3] = fVar3 * fVar4;
    out_buffer[4] = fVar5 * fVar6;
    out_buffer[5] = fVar5 * fVar6;
    out_buffer[5] = fVar5;
    out_buffer[6] = fVar6;
    out_buffer[6] = fVar7;
    out_buffer[7] = fVar8;
    out_buffer[8] = fVar7 * fVar8;
    out_buffer[9] = fVar7 * fVar8;
    out_buffer[10] = fVar9 * fVar10;
    out_buffer[0xb] = fVar9 * fVar10;
    out_buffer[0xb] = fVar9;
    out_buffer[0xc] = fVar10;
    out_buffer = out_buffer + 0xc;
    pfVar12 = pfVar11 + 0x10;
    pfVar11 = pfVar11 + 8;
  }
  for (; pfVar11 < pfVar1; pfVar11 = pfVar11 + 2) {
    uVar2 = *(undefined8 *)pfVar11;
    *(undefined8 *)out_buffer = uVar2;
    out_buffer[2] = (float)((ulong)uVar2 >> 0x20) * (float)uVar2;
    out_buffer = out_buffer + 3;
  }
  return;
}

Assistant:

static void stbir__fancy_alpha_weight_2ch( float * out_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) out = out_buffer;
  float const * end_decode = out_buffer + ( width_times_channels / 2 ) * 3;
  float STBIR_STREAMOUT_PTR(*) decode = (float*)end_decode - width_times_channels;

  //  for fancy alpha, turns into: [X A Xpm][X A Xpm],etc

  #ifdef STBIR_SIMD

  decode += 8;
  if ( decode <= end_decode )
  {
    STBIR_NO_UNROLL_LOOP_START
    do {
      #ifdef STBIR_SIMD8
      stbir__simdf8 d0,a0,p0;
      STBIR_NO_UNROLL(decode);
      stbir__simdf8_load( d0, decode-8 );
      stbir__simdf8_0123to11331133( p0, d0 );
      stbir__simdf8_0123to00220022( a0, d0 );
      stbir__simdf8_mult( p0, p0, a0 );

      stbir__simdf_store2( out, stbir__if_simdf8_cast_to_simdf4( d0 ) );
      stbir__simdf_store( out+2, stbir__if_simdf8_cast_to_simdf4( p0 ) );
      stbir__simdf_store2h( out+3, stbir__if_simdf8_cast_to_simdf4( d0 ) );

      stbir__simdf_store2( out+6, stbir__simdf8_gettop4( d0 ) );
      stbir__simdf_store( out+8, stbir__simdf8_gettop4( p0 ) );
      stbir__simdf_store2h( out+9, stbir__simdf8_gettop4( d0 ) );
      #else
      stbir__simdf d0,a0,d1,a1,p0,p1;
      STBIR_NO_UNROLL(decode);
      stbir__simdf_load( d0, decode-8 );
      stbir__simdf_load( d1, decode-8+4 );
      stbir__simdf_0123to1133( p0, d0 );
      stbir__simdf_0123to1133( p1, d1 );
      stbir__simdf_0123to0022( a0, d0 );
      stbir__simdf_0123to0022( a1, d1 );
      stbir__simdf_mult( p0, p0, a0 );
      stbir__simdf_mult( p1, p1, a1 );

      stbir__simdf_store2( out, d0 );
      stbir__simdf_store( out+2, p0 );
      stbir__simdf_store2h( out+3, d0 );

      stbir__simdf_store2( out+6, d1 );
      stbir__simdf_store( out+8, p1 );
      stbir__simdf_store2h( out+9, d1 );
      #endif
      decode += 8;
      out += 12;
    } while ( decode <= end_decode );
  }
  decode -= 8;
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode < end_decode )
  {
    float x = decode[0], y = decode[1];
    STBIR_SIMD_NO_UNROLL(decode);
    out[0] = x;
    out[1] = y;
    out[2] = x * y;
    out += 3;
    decode += 2;
  }
}